

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::onResultAccepted(Network *this)

{
  char *in_stack_00000020;
  SubmitResult *in_stack_00000028;
  IClient *in_stack_00000030;
  IStrategy *in_stack_00000038;
  Network *in_stack_00000040;
  
  onResultAccepted(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                   in_stack_00000020);
  return;
}

Assistant:

void xmrig::Network::onResultAccepted(IStrategy *, IClient *, const SubmitResult &result, const char *error)
{
    m_state.add(result, error);

    if (error) {
        LOG_INFO("%s " RED_BOLD("rejected") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " RED("\"%s\"") " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, error, result.elapsed);
    }
    else {
        LOG_INFO("%s " GREEN_BOLD("accepted") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, result.elapsed);
    }
}